

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O3

loader_handle ext_loader_impl_load_from_file(loader_impl impl,loader_path *paths,size_t size)

{
  int iVar1;
  loader_impl_ext ext_impl;
  loader_impl_ext_handle ext_handle;
  
  ext_impl = (loader_impl_ext)loader_impl_get();
  if (ext_impl == (loader_impl_ext)0x0) {
LAB_001036d7:
    ext_handle = (loader_impl_ext_handle)0x0;
  }
  else {
    ext_handle = (loader_impl_ext_handle)operator_new(0x18);
    (ext_handle->extensions).
    super__Vector_base<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (ext_handle->extensions).
    super__Vector_base<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (ext_handle->extensions).
    super__Vector_base<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (size != 0) {
      do {
        iVar1 = ext_loader_impl_load_from_file_handle(ext_impl,ext_handle,*paths);
        if (iVar1 != 0) goto LAB_001036d7;
        paths = paths + 1;
        size = size - 1;
      } while (size != 0);
    }
  }
  return ext_handle;
}

Assistant:

loader_handle ext_loader_impl_load_from_file(loader_impl impl, const loader_path paths[], size_t size)
{
	loader_impl_ext ext_impl = static_cast<loader_impl_ext>(loader_impl_get(impl));

	if (ext_impl == NULL)
	{
		return NULL;
	}

	loader_impl_ext_handle ext_handle = new loader_impl_ext_handle_type();

	if (ext_handle == nullptr)
	{
		return NULL;
	}

	for (size_t iterator = 0; iterator < size; ++iterator)
	{
		if (ext_loader_impl_load_from_file_handle(ext_impl, ext_handle, paths[iterator]) != 0)
		{
			return NULL;
		}
	}

	return ext_handle;
}